

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeNdPoints.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
CreateRandomPoint(vector<float,_std::allocator<float>_> *__return_storage_ptr__,int N)

{
  result_type rVar1;
  int local_13cc;
  int i;
  uniform_real_distribution<float> uniform_distribution;
  default_random_engine generator;
  undefined1 local_13a8 [8];
  random_device rd;
  result_type_conflict1 local_18;
  int local_14;
  numType x;
  int N_local;
  vector<float,_std::allocator<float>_> *point;
  
  rd.field_0.field2[4999] = 0;
  local_14 = N;
  _x = __return_storage_ptr__;
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__);
  std::random_device::random_device((random_device *)local_13a8);
  rVar1 = std::random_device::operator()((random_device *)local_13a8);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &uniform_distribution,(ulong)rVar1);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)&stack0xffffffffffffec38,0.0,10.0);
  for (local_13cc = 0; local_13cc < local_14; local_13cc = local_13cc + 1) {
    local_18 = std::uniform_real_distribution<float>::operator()
                         ((uniform_real_distribution<float> *)&stack0xffffffffffffec38,
                          (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                          &uniform_distribution);
    std::vector<float,_std::allocator<float>_>::push_back(__return_storage_ptr__,&local_18);
  }
  rd.field_0.field2[4999] = 1;
  std::random_device::~random_device((random_device *)local_13a8);
  if ((rd.field_0.field2[4999] & 1) == 0) {
    std::vector<float,_std::allocator<float>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<numType> CreateRandomPoint(const int N)
{
	    numType x;
		std::vector<numType> point;
    
	    //uniformly generate points
	    std::random_device rd;
	    std::default_random_engine generator( rd() );
	    std::uniform_real_distribution< numType > uniform_distribution(0, 10);
    	
		for( auto i=0; i < N; i++)
		{
	        x = uniform_distribution( generator );
	        point.push_back( x );
	    }
		
		return point;
}